

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFieldInfo
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  GeneratorOptions *options_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  Descriptor *pDVar2;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  long lVar3;
  OneofDescriptor *pOVar4;
  int i;
  long lVar5;
  int j;
  int i_1;
  allocator local_139;
  string local_138;
  GeneratorOptions *local_118;
  Descriptor *local_110;
  string local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oneof_entries;
  string local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  numbers;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oneof_fields;
  
  __return_storage_ptr__ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)desc
  ;
  bVar1 = anon_unknown_0::HasRepeatedFields((GeneratorOptions *)desc,(Descriptor *)options);
  local_118 = options;
  if (bVar1) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,
               (Descriptor *)__return_storage_ptr__);
    std::__cxx11::string::string((string *)&local_c8,".repeatedFields_",(allocator *)&oneof_entries)
    ;
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar3 = 0;
    for (lVar5 = 0; lVar5 < *(int *)(desc + 0x2c); lVar5 = lVar5 + 1) {
      if (*(int *)(*(long *)(desc + 0x30) + 0x4c + lVar3) == 3) {
        bVar1 = FieldDescriptor::is_map((FieldDescriptor *)(*(long *)(desc + 0x30) + lVar3));
        if (!bVar1) {
          (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                    (&local_138,(_anonymous_namespace_ *)(*(long *)(desc + 0x30) + lVar3),field);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&numbers,
                     &local_138);
          std::__cxx11::string::~string((string *)&local_138);
        }
      }
      lVar3 = lVar3 + 0xa8;
    }
    Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_108,(protobuf *)&numbers,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x3508d3,(char *)__return_storage_ptr__);
    std::operator+(&local_138,"[",&local_108);
    options = local_118;
    __return_storage_ptr__ = &local_88;
    std::operator+(__return_storage_ptr__,&local_138,"]");
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_108);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&numbers);
    io::Printer::Print(printer,
                       "/**\n * List of repeated fields within this message type.\n * @private {!Array<number>}\n * @const\n */\n$classname$$rptfieldarray$ = $rptfields$;\n\n"
                       ,"classname",&local_68,"rptfieldarray",&local_c8,"rptfields",
                       __return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_68);
  }
  bVar1 = anon_unknown_0::HasOneofFields(desc);
  if (bVar1) {
    local_110 = desc;
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_c8,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,
               (Descriptor *)__return_storage_ptr__);
    std::__cxx11::string::string((string *)&local_88,".oneofGroups_",&local_139);
    oneof_entries.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    oneof_entries.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    oneof_entries.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (lVar3 = 0; lVar3 < *(int *)(local_110 + 0x38); lVar3 = lVar3 + 1) {
      pOVar4 = (OneofDescriptor *)(lVar3 * 0x30 + *(long *)(local_110 + 0x40));
      pDVar2 = local_110;
      bVar1 = anon_unknown_0::IgnoreOneof(pOVar4);
      if (!bVar1) {
        oneof_fields.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        oneof_fields.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        oneof_fields.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (lVar5 = 0; lVar5 < *(int *)(pOVar4 + 0x1c); lVar5 = lVar5 + 1) {
          bVar1 = anon_unknown_0::IgnoreField
                            (*(FieldDescriptor **)(*(long *)(pOVar4 + 0x20) + lVar5 * 8));
          if (!bVar1) {
            (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                      (&local_138,*(_anonymous_namespace_ **)(*(long *)(pOVar4 + 0x20) + lVar5 * 8),
                       field_00);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &oneof_fields,&local_138);
            std::__cxx11::string::~string((string *)&local_138);
          }
        }
        Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_68,(protobuf *)&oneof_fields,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x3508d3,(char *)pDVar2);
        std::operator+(&local_108,"[",&local_68);
        std::operator+(&local_138,&local_108,"]");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &oneof_entries,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_68);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&oneof_fields);
      }
    }
    Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_108,(protobuf *)&oneof_entries,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x3508d3,(char *)local_110);
    std::operator+(&local_138,"[",&local_108);
    pDVar2 = local_110;
    options_00 = local_118;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&numbers,
                   &local_138,"]");
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_108);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&oneof_entries);
    io::Printer::Print(printer,
                       "/**\n * Oneof group definitions for this message. Each group defines the field\n * numbers belonging to that group. When of these fields\' value is set, all\n * other fields in the group are cleared. During deserialization, if multiple\n * fields are encountered for a group, only the last value seen will be kept.\n * @private {!Array<!Array<number>>}\n * @const\n */\n$classname$$oneofgrouparray$ = $oneofgroups$;\n\n"
                       ,"classname",&local_c8,"oneofgrouparray",&local_88,"oneofgroups",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&numbers
                      );
    std::__cxx11::string::~string((string *)&numbers);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_c8);
    lVar3 = 0;
    for (lVar5 = 0; lVar5 < *(int *)(pDVar2 + 0x38); lVar5 = lVar5 + 1) {
      pOVar4 = (OneofDescriptor *)(*(long *)(pDVar2 + 0x40) + lVar3);
      bVar1 = anon_unknown_0::IgnoreOneof(pOVar4);
      if (!bVar1) {
        GenerateOneofCaseDefinition
                  ((Generator *)pOVar4,options_00,printer,
                   (OneofDescriptor *)(*(long *)(pDVar2 + 0x40) + lVar3));
      }
      lVar3 = lVar3 + 0x30;
    }
  }
  return;
}

Assistant:

void Generator::GenerateClassFieldInfo(const GeneratorOptions& options,
                                       io::Printer* printer,
                                       const Descriptor* desc) const {
  if (HasRepeatedFields(options, desc)) {
    printer->Print(
        "/**\n"
        " * List of repeated fields within this message type.\n"
        " * @private {!Array<number>}\n"
        " * @const\n"
        " */\n"
        "$classname$$rptfieldarray$ = $rptfields$;\n"
        "\n",
        "classname", GetMessagePath(options, desc),
        "rptfieldarray", kRepeatedFieldArrayName,
        "rptfields", RepeatedFieldNumberList(options, desc));
  }

  if (HasOneofFields(desc)) {
    printer->Print(
        "/**\n"
        " * Oneof group definitions for this message. Each group defines the "
        "field\n"
        " * numbers belonging to that group. When of these fields' value is "
        "set, all\n"
        " * other fields in the group are cleared. During deserialization, if "
        "multiple\n"
        " * fields are encountered for a group, only the last value seen will "
        "be kept.\n"
        " * @private {!Array<!Array<number>>}\n"
        " * @const\n"
        " */\n"
        "$classname$$oneofgrouparray$ = $oneofgroups$;\n"
        "\n",
        "classname", GetMessagePath(options, desc),
        "oneofgrouparray", kOneofGroupArrayName,
        "oneofgroups", OneofGroupList(desc));

    for (int i = 0; i < desc->oneof_decl_count(); i++) {
      if (IgnoreOneof(desc->oneof_decl(i))) {
        continue;
      }
      GenerateOneofCaseDefinition(options, printer, desc->oneof_decl(i));
    }
  }
}